

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day14a.cpp
# Opt level: O0

void day14a::hash_and_stretch(char *key,int index,int stretch,MD5Cache *cache)

{
  MD5Value value;
  MD5Value hash;
  int i;
  int length;
  MD5Cache *cache_local;
  int stretch_local;
  int index_local;
  char *key_local;
  
  hash.chunks.d = snprintf(cache->md5,0x24,"%s%d",key,(ulong)(uint)index);
  for (hash.chunks.c = 0; (int)hash.chunks.c <= stretch; hash.chunks.c = hash.chunks.c + 1) {
    value = md5(cache->md5,hash.chunks.d);
    md5_to_chars(cache->md5,value);
    hash.chunks.d = 0x20;
  }
  cache->index = index;
  return;
}

Assistant:

void hash_and_stretch(const char *key, int index, int stretch, MD5Cache& cache) {
		int length = std::snprintf(cache.md5, 36, "%s%d", key, index);
		for(int i = 0; i <= stretch; ++i) {
			auto hash = md5(cache.md5, length);
			md5_to_chars(cache.md5, hash);
			length = 32;
		}
		cache.index = index;
	}